

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_78::BinaryReaderIR::BinaryReaderIR
          (BinaryReaderIR *this,Module *out_module,char *filename,Errors *errors)

{
  Errors *errors_local;
  char *filename_local;
  Module *out_module_local;
  BinaryReaderIR *this_local;
  
  BinaryReaderNop::BinaryReaderNop(&this->super_BinaryReaderNop);
  (this->super_BinaryReaderNop).super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderIR_0034abc8;
  this->errors_ = errors;
  this->module_ = out_module;
  this->current_func_ = (Func *)0x0;
  std::
  vector<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
  ::vector(&this->label_stack_);
  this->current_init_expr_ = (ExprList *)0x0;
  this->filename_ = filename;
  return;
}

Assistant:

BinaryReaderIR::BinaryReaderIR(Module* out_module,
                               const char* filename,
                               Errors* errors)
    : errors_(errors), module_(out_module), filename_(filename) {}